

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O0

void rw::compressPal4(uint8 *dst,uint32 dststride,uint8 *src,uint32 srcstride,int32 w,int32 h)

{
  int local_34;
  int local_30;
  int32 y;
  int32 x;
  int32 h_local;
  int32 w_local;
  uint32 srcstride_local;
  uint8 *src_local;
  uint32 dststride_local;
  uint8 *dst_local;
  
  for (local_34 = 0; local_34 < h; local_34 = local_34 + 1) {
    for (local_30 = 0; local_30 < w / 2; local_30 = local_30 + 1) {
      dst[local_34 * dststride + local_30] =
           src[local_34 * srcstride + local_30 * 2] |
           src[local_34 * srcstride + local_30 * 2 + 1] << 4;
    }
  }
  return;
}

Assistant:

void
compressPal4(uint8 *dst, uint32 dststride, uint8 *src, uint32 srcstride, int32 w, int32 h)
{
	int32 x, y;
	for(y = 0; y < h; y++)
		for(x = 0; x < w/2; x++)
			dst[y*dststride + x] = src[y*srcstride + x*2 + 0] | src[y*srcstride + x*2 + 1] << 4;
}